

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

void __thiscall KV::KeyValues::setKeyValue(KeyValues *this,string *kvValue)

{
  _Rb_tree_node_base *p_Var1;
  
  if ((this->value).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    for (p_Var1 = (this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->keyvalues)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      *(KeyValues **)(*(long *)(p_Var1 + 2) + 0x30) = this->parentKV;
      *(long *)(*(long *)(p_Var1 + 2) + 0x38) = *(long *)(*(long *)(p_Var1 + 2) + 0x38) + -1;
    }
  }
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->value,kvValue);
  return;
}

Assistant:

void KeyValues::setKeyValue( const std::string &kvValue )
	{
		if ( isSection() )
		{
			for ( auto &kv : keyvalues )
			{
				kv.second->parentKV = parentKV;
				--kv.second->depth;
			}
		}

		value = kvValue;
	}